

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.cc
# Opt level: O2

ostream * absl::lts_20240722::operator<<(ostream *os,LogSeverityAtMost s)

{
  ostream *poVar1;
  
  if ((uint)s < 4) {
    poVar1 = std::operator<<(os,"<=");
    poVar1 = operator<<(poVar1,s);
    return poVar1;
  }
  if (s == kNegativeInfinity) {
    poVar1 = std::operator<<(os,"NEGATIVE_INFINITY");
    return poVar1;
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, absl::LogSeverityAtMost s) {
  switch (s) {
    case absl::LogSeverityAtMost::kInfo:
    case absl::LogSeverityAtMost::kWarning:
    case absl::LogSeverityAtMost::kError:
    case absl::LogSeverityAtMost::kFatal:
      return os << "<=" << static_cast<absl::LogSeverity>(s);
    case absl::LogSeverityAtMost::kNegativeInfinity:
      return os << "NEGATIVE_INFINITY";
  }
  return os;
}